

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::changeRow
          (SPxLPBase<double> *this,int n,LPRowBase<double> *newRow,bool scale)

{
  int iVar1;
  SVectorBase<double> *this_00;
  char *pcVar2;
  double *pdVar3;
  int *piVar4;
  byte in_CL;
  LPRowBase<double> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  undefined8 extraout_RDX_03;
  int in_ESI;
  long *in_RDI;
  double val;
  int idx;
  SVectorBase<double> *newrow;
  int position;
  SVectorBase<double> *col;
  SVectorBase<double> *row;
  int j;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  SVectorBase<double> *in_stack_ffffffffffffff78;
  SVectorBase<double> *pSVar6;
  undefined4 in_stack_ffffffffffffff80;
  int iVar7;
  double local_50;
  double local_48;
  double local_40;
  uint local_34;
  SVectorBase<double> *local_30;
  SVectorBase<double> *local_28;
  uint local_20;
  byte local_19;
  LPRowBase<double> *local_18;
  int local_c;
  
  local_19 = in_CL & 1;
  if (-1 < in_ESI) {
    local_18 = in_RDX;
    local_c = in_ESI;
    local_28 = rowVector_w((SPxLPBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff6c);
    local_20 = SVectorBase<double>::size(local_28);
    uVar5 = extraout_RDX;
    while (local_20 = local_20 - 1, -1 < (int)local_20) {
      SVectorBase<double>::index(local_28,(char *)(ulong)local_20,(int)uVar5);
      local_30 = colVector_w((SPxLPBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff6c);
      local_34 = SVectorBase<double>::pos(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      uVar5 = extraout_RDX_00;
      if (-1 < (int)local_34) {
        SVectorBase<double>::remove(local_30,(char *)(ulong)local_34);
        uVar5 = extraout_RDX_01;
      }
    }
    SVectorBase<double>::clear((SVectorBase<double> *)0x260f32);
    iVar7 = local_c;
    local_40 = LPRowBase<double>::lhs(local_18);
    (**(code **)(*in_RDI + 0x198))(in_RDI,iVar7,&local_40,local_19 & 1);
    iVar1 = local_c;
    local_48 = LPRowBase<double>::rhs(local_18);
    (**(code **)(*in_RDI + 0x1b0))(in_RDI,iVar1,&local_48,local_19 & 1);
    iVar1 = local_c;
    local_50 = LPRowBase<double>::obj(local_18);
    (**(code **)(*in_RDI + 0x1e0))(in_RDI,iVar1,&local_50,local_19 & 1);
    this_00 = LPRowBase<double>::rowVector(local_18);
    local_20 = SVectorBase<double>::size(this_00);
    uVar5 = extraout_RDX_02;
    while (local_20 = local_20 - 1, -1 < (int)local_20) {
      pcVar2 = SVectorBase<double>::index(this_00,(char *)(ulong)local_20,(int)uVar5);
      pdVar3 = SVectorBase<double>::value(this_00,local_20);
      pSVar6 = (SVectorBase<double> *)*pdVar3;
      if ((local_19 & 1) != 0) {
        piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),local_c);
        in_stack_ffffffffffffff74 = *piVar4;
        DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),(int)pcVar2);
        spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
        in_stack_ffffffffffffff78 = pSVar6;
      }
      LPRowSetBase<double>::add2
                ((LPRowSetBase<double> *)CONCAT44(iVar7,in_stack_ffffffffffffff80),
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                 (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      LPColSetBase<double>::add2
                ((LPColSetBase<double> *)CONCAT44(iVar7,in_stack_ffffffffffffff80),
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78,
                 (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (double *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      uVar5 = extraout_RDX_03;
    }
  }
  return;
}

Assistant:

virtual void changeRow(int n, const LPRowBase<R>& newRow, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& row = rowVector_w(n);

      for(j = row.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& col = colVector_w(row.index(j));
         int position = col.pos(n);

         assert(position != -1);

         if(position >= 0)
            col.remove(position);
      }

      row.clear();

      changeLhs(n, newRow.lhs(), scale);
      changeRhs(n, newRow.rhs(), scale);
      changeRowObj(n, newRow.obj(), scale);

      const SVectorBase<R>& newrow = newRow.rowVector();

      for(j = newrow.size() - 1; j >= 0; --j)
      {
         int idx = newrow.index(j);
         R val = newrow.value(j);

         if(scale)
            val = spxLdexp(val, LPRowSetBase<R>::scaleExp[n] + LPColSetBase<R>::scaleExp[idx]);

         LPRowSetBase<R>::add2(n, 1, &idx, &val);
         LPColSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }